

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

_Bool ecdsa_verify_msg_as_qelem
                (uint64_t *m_q,uint8_t *public_key,uint8_t *signature_r,uint8_t *signature_s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Bool _Var8;
  uint uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  sbyte sVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint64_t t1;
  ulong uVar22;
  uint uVar23;
  uint64_t t12;
  ulong uVar24;
  ulong uVar25;
  uint64_t *puVar26;
  uint64_t *puVar27;
  uint64_t t1_1;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint64_t *t11_1;
  uint uVar31;
  uint64_t *t11_5;
  ulong uVar32;
  ulong uVar33;
  _Bool _Var34;
  byte bVar35;
  uint64_t tmp [28];
  uint64_t sinv [4];
  uint64_t tmp_1 [12];
  uint64_t zinv [4];
  uint64_t local_eb8 [8];
  uint64_t local_e78;
  uint64_t local_e70;
  uint64_t local_e68;
  uint64_t local_e60;
  uint64_t local_e58 [12];
  ulong local_df8;
  ulong local_df0;
  ulong local_de8;
  ulong local_de0;
  ulong local_dd8;
  ulong local_dd0;
  ulong local_dc8;
  ulong local_dc0;
  uint64_t local_db8 [3];
  undefined8 local_da0;
  int iStack_d9c;
  uint64_t local_d98 [4];
  uint64_t local_d78 [16];
  uint64_t local_cf8;
  ulong uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  uint64_t local_c98 [24];
  uint64_t local_bd8 [12];
  uint64_t local_b78 [12];
  uint64_t local_b18 [12];
  uint64_t local_ab8 [12];
  uint64_t local_a58 [12];
  uint64_t local_9f8 [12];
  uint64_t local_998 [12];
  uint64_t local_938 [12];
  uint64_t local_8d8 [12];
  uint64_t local_878 [12];
  uint64_t local_818 [12];
  uint64_t local_7b8 [12];
  uint64_t local_758 [12];
  uint64_t local_6f8 [12];
  uint64_t local_698 [12];
  uint64_t local_638 [12];
  uint64_t local_5d8 [12];
  uint64_t local_578 [12];
  uint64_t local_518 [12];
  uint64_t local_4b8 [12];
  uint64_t local_458 [12];
  uint64_t local_3f8 [12];
  uint64_t local_398 [12];
  uint64_t local_338 [12];
  uint64_t local_2d8 [12];
  uint64_t local_278 [12];
  uint64_t local_218 [12];
  uint64_t local_1b8 [12];
  uint64_t local_158 [12];
  uint64_t local_f8 [12];
  uint64_t local_98 [13];
  
  bVar35 = 0;
  _Var34 = false;
  memset(local_e58,0,0xe0);
  _Var8 = load_point_vartime(local_e58,public_key);
  uVar29 = *(ulong *)(signature_r + 0x18);
  uVar19 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)(signature_r + 0x10);
  uVar21 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)(signature_r + 8);
  uVar25 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)signature_r;
  uVar24 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)(signature_s + 0x18);
  uVar22 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)(signature_s + 0x10);
  uVar32 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)(signature_s + 8);
  uVar33 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  uVar29 = *(ulong *)signature_s;
  uVar29 = uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
           | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18
           | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38;
  if (_Var8) {
    _Var34 = false;
    local_df8 = uVar19;
    local_df0 = uVar21;
    local_de8 = uVar25;
    local_de0 = uVar24;
    local_dd8 = uVar22;
    local_dd0 = uVar32;
    local_dc8 = uVar33;
    local_dc0 = uVar29;
    uVar10 = FStar_UInt64_eq_mask(uVar32,0);
    uVar11 = FStar_UInt64_eq_mask(uVar22,0);
    uVar12 = FStar_UInt64_eq_mask(uVar33,0);
    uVar13 = FStar_UInt64_eq_mask(uVar29,0);
    uVar14 = FStar_UInt64_eq_mask(uVar21,0);
    uVar15 = FStar_UInt64_eq_mask(uVar19,0);
    uVar16 = FStar_UInt64_eq_mask(uVar25,0);
    uVar17 = FStar_UInt64_eq_mask(uVar24,0);
    if (((uVar29 < 0xffffffff00000000 ||
         uVar29 + 0x100000000 <
         (ulong)(uVar33 != 0xffffffffffffffff ||
                uVar33 + 1 <
                (ulong)(uVar32 < 0xbce6faada7179e84 ||
                       uVar32 + 0x4319055258e8617c < (ulong)(uVar22 < 0xf3b9cac2fc632551)))) &&
        (uVar13 & uVar12 & uVar11 & uVar10) == 0) &&
        ((uVar24 < 0xffffffff00000000 ||
         uVar24 + 0x100000000 <
         (ulong)(uVar25 != 0xffffffffffffffff ||
                uVar25 + 1 <
                (ulong)(uVar21 < 0xbce6faada7179e84 ||
                       uVar21 + 0x4319055258e8617c < (ulong)(uVar19 < 0xf3b9cac2fc632551)))) &&
        (uVar17 & uVar16 & uVar15 & uVar14) == 0)) {
      local_d78[2] = 0;
      local_d78[3] = 0;
      local_d78[0] = 0;
      local_d78[1] = 0;
      qinv(local_d78,&local_dd8);
      qmul_mont(local_d78,m_q,local_db8);
      qmul_mont(local_d78,&local_df8,local_d98);
      memset(local_bd8,0,0xb40);
      local_ca8 = 0;
      uStack_ca0 = 0;
      local_cb8 = 0;
      uStack_cb0 = 0;
      local_cc8 = 0;
      uStack_cc0 = 0;
      local_cd8 = 0;
      uStack_cd0 = 0;
      local_ce8 = 0;
      uStack_ce0 = 0;
      local_cf8 = 0;
      uStack_cf0 = 0;
      local_c98[0] = 0;
      local_c98[1] = 0;
      local_c98[2] = 0;
      local_c98[3] = 0;
      local_c98[4] = 1;
      local_c98[5] = 0xffffffff00000000;
      local_c98[6] = 0xffffffffffffffff;
      local_c98[7] = 0xfffffffe;
      local_c98[8] = 0;
      local_c98[9] = 0;
      local_c98[10] = 0;
      local_c98[0xb] = 0;
      puVar26 = local_e58;
      puVar27 = local_c98 + 0xc;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_c98 + 0xc);
      puVar26 = &local_cf8;
      puVar27 = local_bd8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_bd8);
      puVar26 = &local_cf8;
      puVar27 = local_b78;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_bd8);
      puVar26 = &local_cf8;
      puVar27 = local_b18;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_b18);
      puVar26 = &local_cf8;
      puVar27 = local_ab8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_b78);
      puVar26 = &local_cf8;
      puVar27 = local_a58;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_a58);
      puVar26 = &local_cf8;
      puVar27 = local_9f8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_b18);
      puVar26 = &local_cf8;
      puVar27 = local_998;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_998);
      puVar26 = &local_cf8;
      puVar27 = local_938;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_ab8);
      puVar26 = &local_cf8;
      puVar27 = local_8d8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_8d8);
      puVar26 = &local_cf8;
      puVar27 = local_878;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_a58);
      puVar26 = &local_cf8;
      puVar27 = local_818;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_818);
      puVar26 = &local_cf8;
      puVar27 = local_7b8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_9f8);
      puVar26 = &local_cf8;
      puVar27 = local_758;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_758);
      puVar26 = &local_cf8;
      puVar27 = local_6f8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_998);
      puVar26 = &local_cf8;
      puVar27 = local_698;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_698);
      puVar26 = &local_cf8;
      puVar27 = local_638;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_938);
      puVar26 = &local_cf8;
      puVar27 = local_5d8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_5d8);
      puVar26 = &local_cf8;
      puVar27 = local_578;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_8d8);
      puVar26 = &local_cf8;
      puVar27 = local_518;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_518);
      puVar26 = &local_cf8;
      puVar27 = local_4b8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_878);
      puVar26 = &local_cf8;
      puVar27 = local_458;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_458);
      puVar26 = &local_cf8;
      puVar27 = local_3f8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_818);
      puVar26 = &local_cf8;
      puVar27 = local_398;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_398);
      puVar26 = &local_cf8;
      puVar27 = local_338;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_7b8);
      puVar26 = &local_cf8;
      puVar27 = local_2d8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_2d8);
      puVar26 = &local_cf8;
      puVar27 = local_278;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_758);
      puVar26 = &local_cf8;
      puVar27 = local_218;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_218);
      puVar26 = &local_cf8;
      puVar27 = local_1b8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_double(&local_cf8,local_6f8);
      puVar26 = &local_cf8;
      puVar27 = local_158;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(&local_cf8,local_e58,local_158);
      puVar26 = &local_cf8;
      puVar27 = local_f8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      puVar26 = (uint64_t *)
                ((long)Hacl_P256_PrecompTable_precomp_basepoint_table_w5 +
                (ulong)(iStack_d9c >> 0x1f & 0x60));
      puVar27 = local_eb8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      puVar26 = local_c98;
      if ((long)local_d98[3] < 0) {
        puVar26 = local_c98 + 0xc;
      }
      puVar27 = local_98;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      point_add(local_eb8,local_eb8,local_98);
      uVar23 = 0xfa;
      do {
        point_double(local_eb8,local_eb8);
        point_double(local_eb8,local_eb8);
        point_double(local_eb8,local_eb8);
        point_double(local_eb8,local_eb8);
        point_double(local_eb8,local_eb8);
        uVar30 = uVar23 >> 6;
        uVar31 = uVar23 & 0x3f;
        sVar18 = (sbyte)uVar31;
        uVar9 = (uint)(local_d98[uVar30] >> sVar18);
        if (uVar31 != 0 && uVar23 < 0xc0) {
          uVar9 = uVar9 | (uint)(local_d98[uVar30 + 1] << (-sVar18 & 0x3fU));
        }
        puVar26 = (uint64_t *)((long)local_c98 + (ulong)((uVar9 & 0x1f) * 0x60));
        puVar27 = local_d78 + 4;
        for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar27 = *puVar26;
          puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
          puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
        }
        point_add(local_eb8,local_eb8,local_d78 + 4);
        uVar9 = (uint)(local_db8[uVar30] >> sVar18);
        if (uVar31 != 0 && uVar23 < 0xc0) {
          uVar9 = uVar9 | (uint)(local_db8[uVar30 + 1] << (-sVar18 & 0x3fU));
        }
        puVar26 = (uint64_t *)
                  ((long)Hacl_P256_PrecompTable_precomp_basepoint_table_w5 +
                  (ulong)((uVar9 & 0x1f) * 0x60));
        puVar27 = local_d78 + 4;
        for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar27 = *puVar26;
          puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
          puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
        }
        point_add(local_eb8,local_eb8,local_d78 + 4);
        uVar23 = uVar23 - 5;
      } while (uVar23 != 0xfffffffb);
      uVar10 = FStar_UInt64_eq_mask(local_e78,0);
      uVar11 = FStar_UInt64_eq_mask(local_e70,0);
      uVar12 = FStar_UInt64_eq_mask(local_e68,0);
      uVar13 = FStar_UInt64_eq_mask(local_e60,0);
      if ((uVar13 & uVar12 & uVar11 & uVar10) == 0xffffffffffffffff) {
        _Var34 = false;
      }
      else {
        local_ce8 = 0;
        uStack_ce0 = 0;
        local_cf8 = 0;
        uStack_cf0 = 0;
        local_c98[2] = 0;
        local_c98[3] = 0;
        local_c98[0] = 0;
        local_c98[1] = 0;
        finv(local_c98,&local_e78);
        fmul0(&local_cf8,local_eb8,local_c98);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_cf8;
        uVar21 = SUB168(auVar1 * ZEXT816(0xffffffff00000001),0);
        uVar22 = uVar21 + uStack_ce0;
        uVar25 = (local_cf8 << 0x20) + uStack_cf0;
        uVar29 = (ulong)CARRY8(local_cf8 << 0x20,uStack_cf0);
        uVar19 = (local_cf8 >> 0x20) + local_ce8;
        uVar32 = uVar19 + uVar29;
        uVar29 = (ulong)(CARRY8(local_cf8 >> 0x20,local_ce8) || CARRY8(uVar19,uVar29));
        uVar24 = uVar22 + uVar29;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = SUB168(auVar1 * ZEXT816(0xffffffff00000001),8) +
                       (ulong)CARRY8(uVar21,uStack_ce0) + (ulong)CARRY8(uVar22,uVar29);
        uVar21 = uVar25 >> 0x20;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar25;
        uVar22 = (uStack_cf0 << 0x20) + uVar32;
        uVar29 = (ulong)CARRY8(uStack_cf0 << 0x20,uVar32);
        uVar19 = uVar21 + uVar24;
        uVar28 = uVar19 + uVar29;
        auVar1 = auVar2 * ZEXT816(0xffffffff00000001) + auVar5 +
                 ZEXT116(CARRY8(uVar21,uVar24) || CARRY8(uVar19,uVar29));
        uVar24 = auVar1._0_8_;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auVar1._8_8_;
        uVar21 = uVar22 >> 0x20;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar22;
        uVar25 = (uVar32 << 0x20) + uVar28;
        uVar29 = (ulong)CARRY8(uVar32 << 0x20,uVar28);
        uVar19 = uVar21 + uVar24;
        uVar22 = uVar19 + uVar29;
        auVar1 = auVar3 * ZEXT816(0xffffffff00000001) + auVar6 +
                 ZEXT116(CARRY8(uVar21,uVar24) || CARRY8(uVar19,uVar29));
        uVar24 = auVar1._0_8_;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auVar1._8_8_;
        uVar21 = uVar25 >> 0x20;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar25;
        uVar33 = (uVar28 << 0x20) + uVar22;
        uVar29 = (ulong)CARRY8(uVar28 << 0x20,uVar22);
        uVar19 = uVar21 + uVar24;
        uVar25 = uVar19 + uVar29;
        auVar1 = auVar4 * ZEXT816(0xffffffff00000001) + auVar7 +
                 ZEXT116(CARRY8(uVar21,uVar24) || CARRY8(uVar19,uVar29));
        uVar21 = auVar1._0_8_;
        uVar22 = auVar1._8_8_;
        uVar29 = (ulong)(uVar25 < 0xffffffff ||
                        uVar25 - 0xffffffff < (ulong)(uVar33 != 0xffffffffffffffff));
        uVar19 = (ulong)(uVar21 < uVar29);
        uVar28 = (ulong)(uVar22 < 0xffffffff00000001 || uVar22 + 0xffffffff < uVar19);
        uVar32 = -uVar28;
        uVar28 = uVar28 - 1;
        uVar24 = uVar33 + 1 & uVar28 | uVar33 & uVar32;
        uVar33 = (uVar25 - 0xffffffff) - (ulong)(uVar33 != 0xffffffffffffffff) & uVar28 |
                 uVar25 & uVar32;
        uVar25 = uVar21 - uVar29 & uVar28 | uVar21 & uVar32;
        uVar21 = uVar28 & (uVar22 + 0xffffffff) - uVar19 | uVar32 & uVar22;
        uVar29 = (ulong)(uVar33 < 0xbce6faada7179e84 ||
                        uVar33 + 0x4319055258e8617c < (ulong)(uVar24 < 0xf3b9cac2fc632551));
        uVar19 = (ulong)(uVar25 != 0xffffffffffffffff || uVar25 + 1 < uVar29);
        uVar10 = FStar_UInt64_eq_mask
                           ((ulong)(uVar21 < 0xffffffff00000000 || uVar21 + 0x100000000 < uVar19),0)
        ;
        uVar11 = FStar_UInt64_eq_mask
                           ((uVar24 + 0xc46353d039cdaaf ^ uVar24) & uVar10 ^ uVar24,local_df8);
        uVar12 = FStar_UInt64_eq_mask
                           (((uVar33 + 0x4319055258e8617c) - (ulong)(uVar24 < 0xf3b9cac2fc632551) ^
                            uVar33) & uVar10 ^ uVar33,local_df0);
        uVar13 = FStar_UInt64_eq_mask(((uVar25 + 1) - uVar29 ^ uVar25) & uVar10 ^ uVar25,local_de8);
        uVar10 = FStar_UInt64_eq_mask
                           (((uVar21 + 0x100000000) - uVar19 ^ uVar21) & uVar10 ^ uVar21,local_de0);
        _Var34 = (uVar10 & uVar13 & uVar12 & uVar11) == 0xffffffffffffffff;
      }
    }
  }
  return _Var34;
}

Assistant:

static inline bool
ecdsa_verify_msg_as_qelem(
  uint64_t *m_q,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t tmp[28U] = { 0U };
  uint64_t *pk = tmp;
  uint64_t *r_q = tmp + 12U;
  uint64_t *s_q = tmp + 16U;
  uint64_t *u1 = tmp + 20U;
  uint64_t *u2 = tmp + 24U;
  bool is_pk_valid = load_point_vartime(pk, public_key);
  bn_from_bytes_be4(r_q, signature_r);
  bn_from_bytes_be4(s_q, signature_s);
  uint64_t is_r_valid = bn_is_lt_order_and_gt_zero_mask4(r_q);
  uint64_t is_s_valid = bn_is_lt_order_and_gt_zero_mask4(s_q);
  bool is_rs_valid = is_r_valid == 0xFFFFFFFFFFFFFFFFULL && is_s_valid == 0xFFFFFFFFFFFFFFFFULL;
  if (!(is_pk_valid && is_rs_valid))
  {
    return false;
  }
  uint64_t sinv[4U] = { 0U };
  qinv(sinv, s_q);
  qmul_mont(sinv, m_q, u1);
  qmul_mont(sinv, r_q, u2);
  uint64_t res[12U] = { 0U };
  point_mul_double_g(res, u1, u2, pk);
  if (is_point_at_inf_vartime(res))
  {
    return false;
  }
  uint64_t x[4U] = { 0U };
  to_aff_point_x(x, res);
  qmod_short(x, x);
  bool res1 = bn_is_eq_vartime4(x, r_q);
  return res1;
}